

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::GenerateCTestNotesOutput(cmCTest *this,cmXMLWriter *xml,VectorOfStrings *files)

{
  bool bVar1;
  char *__rhs;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  string note_time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string buildname;
  ostringstream cmCTestLog_msg_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [22];
  ifstream ifs;
  byte abStack_218 [488];
  
  std::__cxx11::string::string((string *)&cmCTestLog_msg_1,"BuildName",(allocator *)&note_time);
  GetCTestConfiguration((string *)&ifs,this,(string *)&cmCTestLog_msg_1);
  SafeBuildIdField(&buildname,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  cmXMLWriter::StartDocument(xml,"UTF-8");
  cmXMLWriter::ProcessingInstruction
            (xml,"xml-stylesheet",
             "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
            );
  std::__cxx11::string::string((string *)&ifs,"Site",(allocator *)&cmCTestLog_msg_1);
  cmXMLWriter::StartElement(xml,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildName",&buildname);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCTestLog_msg_1,&this->CurrentTag,"-");
  GetTestModelString_abi_cxx11_(&note_time,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCTestLog_msg_1,&note_time);
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"BuildStamp",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::~string((string *)&note_time);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  std::__cxx11::string::string((string *)&cmCTestLog_msg_1,"Site",(allocator *)&note_time);
  GetCTestConfiguration((string *)&ifs,this,(string *)&cmCTestLog_msg_1);
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"Name",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  std::__cxx11::string::string((string *)&cmCTestLog_msg_1,"ctest",(allocator *)&note_time);
  __rhs = cmVersion::GetCMakeVersion();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCTestLog_msg_1,__rhs);
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"Generator",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  AddSiteProperties(this,xml);
  std::__cxx11::string::string((string *)&ifs,"Notes",(allocator *)&cmCTestLog_msg_1);
  cmXMLWriter::StartElement(xml,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  for (__rhs_00 = &((files->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>).
                    _M_impl.super__Vector_impl_data._M_start)->super_string;
      __rhs_00 !=
      &((files->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>)._M_impl.
        super__Vector_impl_data._M_finish)->super_string; __rhs_00 = __rhs_00 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar2 = std::operator<<((ostream *)&ifs,"\tAdd file: ");
    poVar2 = std::operator<<(poVar2,(string *)__rhs_00);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x674,_cmCTestLog_msg_1,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    CurrentTime_abi_cxx11_(&note_time,this);
    std::__cxx11::string::string((string *)&ifs,"Note",(allocator *)&cmCTestLog_msg_1);
    cmXMLWriter::StartElement(xml,(string *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
    cmXMLWriter::Attribute<cmsys::String>(xml,"Name",(String *)__rhs_00);
    std::__cxx11::string::string((string *)&ifs,"Time",(allocator *)&local_3f0);
    _cmCTestLog_msg_1 = (pointer)cmsys::SystemTools::GetTime();
    cmXMLWriter::Element<double>(xml,(string *)&ifs,(double *)&cmCTestLog_msg_1);
    std::__cxx11::string::~string((string *)&ifs);
    std::__cxx11::string::string((string *)&ifs,"DateTime",(allocator *)&cmCTestLog_msg_1);
    cmXMLWriter::Element<std::__cxx11::string>(xml,(string *)&ifs,&note_time);
    std::__cxx11::string::~string((string *)&ifs);
    std::__cxx11::string::string((string *)&ifs,"Text",(allocator *)&cmCTestLog_msg_1);
    cmXMLWriter::StartElement(xml,(string *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
    std::ifstream::ifstream((string *)&ifs,(__rhs_00->_M_dataplus)._M_p,_S_in);
    if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
      _cmCTestLog_msg_1 = (pointer)local_3a0;
      local_3a0[0]._M_local_buf[0] = '\0';
      while( true ) {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&ifs,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cmCTestLog_msg_1,(bool *)0x0,-1);
        if (!bVar1) break;
        cmXMLWriter::Content<std::__cxx11::string>
                  (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg_1);
        cmXMLWriter::Content<char[2]>(xml,(char (*) [2])0x58af29);
      }
      std::ifstream::close();
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    }
    else {
      std::operator+(&local_3f0,"Problem reading file: ",__rhs_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg_1,&local_3f0,"\n");
      cmXMLWriter::Content<std::__cxx11::string>
                (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
      poVar2 = std::operator<<((ostream *)&cmCTestLog_msg_1,"Problem reading file: ");
      poVar2 = std::operator<<(poVar2,(string *)__rhs_00);
      poVar2 = std::operator<<(poVar2," while creating notes");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0x68a,local_3f0._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
    }
    cmXMLWriter::EndElement(xml);
    cmXMLWriter::EndElement(xml);
    std::ifstream::~ifstream((string *)&ifs);
    std::__cxx11::string::~string((string *)&note_time);
  }
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndDocument(xml);
  std::__cxx11::string::~string((string *)&buildname);
  return 1;
}

Assistant:

int cmCTest::GenerateCTestNotesOutput(cmXMLWriter& xml,
  const cmCTest::VectorOfStrings& files)
{
  std::string buildname = cmCTest::SafeBuildIdField(
    this->GetCTestConfiguration("BuildName"));
  cmCTest::VectorOfStrings::const_iterator it;
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet", "type=\"text/xsl\" "
    "href=\"Dart/Source/Server/XSL/Build.xsl "
    "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp", this->CurrentTag+"-"+this->GetTestModelString());
  xml.Attribute("Name", this->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",std::string("ctest")+cmVersion::GetCMakeVersion());
  this->AddSiteProperties(xml);
  xml.StartElement("Notes");

  for ( it = files.begin(); it != files.end(); it ++ )
    {
    cmCTestLog(this, OUTPUT, "\tAdd file: " << *it << std::endl);
    std::string note_time = this->CurrentTime();
    xml.StartElement("Note");
    xml.Attribute("Name", *it);
    xml.Element("Time", cmSystemTools::GetTime());
    xml.Element("DateTime", note_time);
    xml.StartElement("Text");
    cmsys::ifstream ifs(it->c_str());
    if ( ifs )
      {
      std::string line;
      while ( cmSystemTools::GetLineFromStream(ifs, line) )
        {
        xml.Content(line);
        xml.Content("\n");
        }
      ifs.close();
      }
    else
      {
      xml.Content("Problem reading file: " + *it + "\n");
      cmCTestLog(this, ERROR_MESSAGE, "Problem reading file: " << *it
        << " while creating notes" << std::endl);
      }
    xml.EndElement(); // Text
    xml.EndElement(); // Note
    }
  xml.EndElement(); // Notes
  xml.EndElement(); // Site
  xml.EndDocument();
  return 1;
}